

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void build_impute_node<InputData<double,int>&,WorkerMemory<ImputedData<int,double>,double,double>&,double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<int,_double>,_double,_double> *workspace,
               InputData<double,_int> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  pointer puVar1;
  WeighImpRows WVar2;
  size_t sVar3;
  pointer pdVar4;
  pointer pdVar5;
  int *piVar6;
  pointer pIVar7;
  pointer pdVar8;
  double *pdVar9;
  bool bVar10;
  bool bVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar12;
  ulong *puVar13;
  uchar *puVar14;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  size_t col;
  double *pdVar18;
  ulong *key;
  pointer pvVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  size_t col_2;
  size_t col_1;
  InputData<double,_int> *pIVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  long lVar29;
  undefined4 uVar30;
  int iVar35;
  double dVar31;
  undefined4 uVar36;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  pointer puVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar47;
  double dVar45;
  undefined1 auVar46 [16];
  double dVar48;
  undefined1 auVar49 [16];
  double dVar50;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar51;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *__range3_1;
  double __tmp;
  size_t ix;
  tuple<> local_b1;
  InputData<double,_int> *local_b0;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_a8;
  pointer local_a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_98;
  pointer local_90;
  vector<double,_std::allocator<double>_> *local_88;
  vector<double,_std::allocator<double>_> *local_80;
  undefined1 local_78 [16];
  double local_60;
  unsigned_long local_58;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_50;
  size_t local_48;
  ModelParams *local_40;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_38;
  
  bVar10 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar11 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_b0 = input_data;
  local_50 = imputer_tree;
  local_48 = curr_depth;
  local_40 = model_params;
  if (bVar10 && bVar11) {
    lVar28 = (workspace->end - workspace->st) + 1;
    auVar32._8_4_ = (int)((ulong)lVar28 >> 0x20);
    auVar32._0_8_ = lVar28;
    auVar32._12_4_ = 0x45300000;
    dVar31 = auVar32._8_8_ - 1.9342813113834067e+25;
    local_78._0_8_ = dVar31 + ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0);
    local_78._8_8_ = dVar31;
  }
  else {
    local_78._0_8_ =
         calculate_sum_weights<double>
                   (&workspace->ix_arr,workspace->st,workspace->end,curr_depth,
                    &workspace->weights_arr,&workspace->weights_map);
    local_78._8_8_ = extraout_XMM0_Qb;
  }
  pIVar25 = local_b0;
  local_a8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&imputer->num_sum,local_b0->ncols_numeric,(value_type_conflict *)&local_a8);
  local_88 = &imputer->num_weight;
  local_a8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_88,pIVar25->ncols_numeric,(value_type_conflict *)&local_a8);
  local_98 = &imputer->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_98,pIVar25->ncols_categ);
  local_80 = &imputer->cat_weight;
  local_a8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_80,pIVar25->ncols_categ,(value_type_conflict *)&local_a8);
  if ((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
              (&imputer->num_sum);
  }
  if ((imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_88)
    ;
  }
  pvVar12 = local_98;
  if ((imputer->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (imputer->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
    ::_S_do_it(local_98);
  }
  if ((imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_80)
    ;
  }
  uVar16 = local_b0->ncols_categ;
  if (uVar16 != 0) {
    lVar28 = 0;
    uVar26 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((pvVar12->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar28),(long)local_b0->ncat[uVar26]);
      pvVar19 = (pvVar12->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar28 + 0x10) !=
          *(long *)((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar28 + 8)) {
        std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar28));
      }
      uVar26 = uVar26 + 1;
      uVar16 = local_b0->ncols_categ;
      lVar28 = lVar28 + 0x18;
    } while (uVar26 < uVar16);
  }
  auVar32 = _DAT_0036b1d0;
  sVar3 = local_b0->ncols_numeric;
  pIVar25 = local_b0;
  if ((uVar16 != 0) || (local_b0->Xc_indptr == (int *)0x0 && sVar3 != 0)) {
    pdVar18 = local_b0->numeric_data;
    if (bVar10 && bVar11) {
      if (sVar3 != 0 && pdVar18 != (double *)0x0) {
        puVar1 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar26 = workspace->st;
        uVar20 = workspace->end;
        sVar21 = local_b0->nrows;
        pdVar4 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar24 = 0;
        do {
          dVar31 = 0.0;
          if (uVar26 <= uVar20) {
            pdVar5 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar28 = 0;
            uVar22 = uVar26;
            do {
              uVar30 = SUB164(ZEXT816(0x4530000043300000),0);
              uVar36 = SUB164(ZEXT816(0x4530000043300000),4);
              dVar31 = auVar32._0_8_;
              dVar48 = auVar32._8_8_;
              if ((ulong)ABS(pdVar18[sVar21 * sVar24 + puVar1[uVar22]]) < 0x7ff0000000000000) {
                lVar28 = lVar28 + 1;
                dVar45 = pdVar5[sVar24];
                auVar43._8_4_ = (int)((ulong)lVar28 >> 0x20);
                auVar43._0_8_ = lVar28;
                auVar43._12_4_ = uVar36;
                pdVar5[sVar24] =
                     (pdVar18[sVar21 * sVar24 + puVar1[uVar22]] - dVar45) /
                     ((auVar43._8_8_ - dVar48) + ((double)CONCAT44(uVar30,(int)lVar28) - dVar31)) +
                     dVar45;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 <= uVar20);
            auVar42._8_4_ = (int)((ulong)lVar28 >> 0x20);
            auVar42._0_8_ = lVar28;
            auVar42._12_4_ = uVar36;
            dVar31 = (auVar42._8_8_ - dVar48) + ((double)CONCAT44(uVar30,(int)lVar28) - dVar31);
          }
          pdVar4[sVar24] = dVar31;
          sVar24 = sVar24 + 1;
        } while (sVar24 != sVar3);
      }
      piVar15 = local_b0->categ_data;
      if (uVar16 != 0 && piVar15 != (int *)0x0) {
        puVar1 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar26 = workspace->st;
        uVar20 = workspace->end;
        sVar3 = local_b0->nrows;
        pdVar4 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar22 = 0;
        dVar31 = (double)DAT_0036b1d0;
        dVar48 = DAT_0036b1d0._8_8_;
        do {
          dVar45 = 0.0;
          if (uVar26 <= uVar20) {
            pvVar19 = (local_98->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar28 = 0;
            uVar23 = uVar26;
            do {
              lVar29 = (long)piVar15[sVar3 * uVar22 + puVar1[uVar23]];
              if (-1 < lVar29) {
                lVar28 = lVar28 + 1;
                lVar17 = *(long *)&pvVar19[uVar22].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                *(double *)(lVar17 + lVar29 * 8) = *(double *)(lVar17 + lVar29 * 8) + 1.0;
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 <= uVar20);
            auVar44._8_4_ = (int)((ulong)lVar28 >> 0x20);
            auVar44._0_8_ = lVar28;
            auVar44._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar45 = (auVar44._8_8_ - dVar48) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar28) - dVar31);
          }
          pdVar4[uVar22] = dVar45;
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar16);
      }
    }
    else {
      if ((pdVar18 != (double *)0x0) && (local_b0->ncols_numeric != 0)) {
        uVar16 = 0;
        do {
          uVar26 = workspace->st;
          dVar31 = 0.0;
          if (uVar26 <= workspace->end) {
            lVar28 = uVar26 * 8;
            auVar40 = ZEXT816(0);
            do {
              puVar37 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar29 = *(long *)((long)puVar37 + lVar28);
              puVar1 = (pointer)pIVar25->numeric_data[lVar29 + pIVar25->nrows * uVar16];
              if ((ulong)ABS((double)puVar1) < 0x7ff0000000000000) {
                pdVar4 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar4) {
                  local_a8._M_head_impl = (unsigned_long *)((long)puVar37 + lVar28);
                  local_a0 = (pointer)dVar31;
                  local_90 = puVar1;
                  local_60 = auVar40._0_8_;
                  pVar51 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                       *)&workspace->weights_map,local_a8._M_head_impl,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_a8,(tuple<> *)&local_58
                                     );
                  puVar14 = (pVar51.first.m_bucket.m_bucket)->m_value + 8;
                  pIVar25 = local_b0;
                  dVar48 = local_60;
                  puVar37 = local_a0;
                  puVar1 = local_90;
                }
                else {
                  puVar14 = (uchar *)(pdVar4 + lVar29);
                  dVar48 = auVar40._0_8_;
                  puVar37 = (pointer)dVar31;
                }
                dVar31 = *(double *)puVar14;
                pdVar4 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar4[uVar16] = dVar31 + pdVar4[uVar16];
                dVar48 = (double)puVar1 * dVar31 - dVar48;
                dVar31 = (double)puVar37 + dVar48;
                auVar40._0_8_ = (dVar31 - (double)puVar37) - dVar48;
                auVar40._8_8_ = 0;
              }
              uVar26 = uVar26 + 1;
              lVar28 = lVar28 + 8;
            } while (uVar26 <= workspace->end);
          }
          (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] =
               dVar31 / (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar16 < pIVar25->ncols_numeric);
      }
      if ((pIVar25->ncols_categ != 0) && (uVar16 = workspace->st, uVar16 <= workspace->end)) {
        do {
          local_58 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16];
          pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar4) {
            local_a8._M_head_impl = &local_58;
            pVar51 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&local_58,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a8,&local_b1);
            puVar14 = (pVar51.first.m_bucket.m_bucket)->m_value + 8;
            pIVar25 = local_b0;
          }
          else {
            puVar14 = (uchar *)(pdVar4 + local_58);
          }
          sVar3 = pIVar25->ncols_categ;
          if (sVar3 != 0) {
            dVar31 = *(double *)puVar14;
            sVar21 = pIVar25->nrows;
            piVar15 = pIVar25->categ_data + local_58;
            pvVar19 = (local_98->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pdVar4 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            sVar24 = 0;
            do {
              lVar28 = (long)*piVar15;
              if (-1 < lVar28) {
                lVar29 = *(long *)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data;
                *(double *)(lVar29 + lVar28 * 8) = *(double *)(lVar29 + lVar28 * 8) + dVar31;
                pdVar4[sVar24] = pdVar4[sVar24] + dVar31;
              }
              sVar24 = sVar24 + 1;
              piVar15 = piVar15 + sVar21;
              pvVar19 = pvVar19 + 1;
            } while (sVar3 != sVar24);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 <= workspace->end);
      }
    }
  }
  auVar43 = _DAT_0036b1f0;
  auVar32 = _DAT_0036b1e0;
  if (pIVar25->Xc_indptr != (int *)0x0) {
    local_90 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar4 != pdVar5) {
      uVar16 = (long)pdVar5 + (-8 - (long)pdVar4);
      auVar33._8_4_ = (int)uVar16;
      auVar33._0_8_ = uVar16;
      auVar33._12_4_ = (int)(uVar16 >> 0x20);
      auVar34._0_8_ = uVar16 >> 3;
      auVar34._8_8_ = auVar33._8_8_ >> 3;
      uVar26 = 0;
      auVar34 = auVar34 ^ _DAT_0036b1f0;
      do {
        auVar41._8_4_ = (int)uVar26;
        auVar41._0_8_ = uVar26;
        auVar41._12_4_ = (int)(uVar26 >> 0x20);
        auVar42 = (auVar41 | auVar32) ^ auVar43;
        bVar10 = auVar34._0_4_ < auVar42._0_4_;
        iVar35 = auVar34._4_4_;
        iVar47 = auVar42._4_4_;
        if ((bool)(~(iVar35 < iVar47 || iVar47 == iVar35 && bVar10) & 1)) {
          pdVar4[uVar26] = (double)local_78._0_8_;
        }
        if (iVar35 >= iVar47 && (iVar47 != iVar35 || !bVar10)) {
          pdVar4[uVar26 + 1] = (double)local_78._0_8_;
        }
        uVar26 = uVar26 + 2;
      } while (((uVar16 >> 3) + 2 & 0xfffffffffffffffe) != uVar26);
    }
    if (pIVar25->ncols_numeric != 0) {
      local_a0 = local_90 + 1;
      local_38 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                  *)&workspace->weights_map;
      uVar16 = 0;
      do {
        lVar28 = (long)pIVar25->Xc_indptr[uVar16];
        key = local_90 + workspace->st;
        uVar26 = (long)((long)local_a0 + (workspace->end * 8 - (long)key)) >> 3;
        if (0 < (long)uVar26) {
          do {
            uVar20 = uVar26 >> 1;
            uVar22 = ~uVar20 + uVar26;
            uVar26 = uVar20;
            if ((key + uVar20 + 1)[-1] < (ulong)(long)pIVar25->Xc_ind[lVar28]) {
              key = key + uVar20 + 1;
              uVar26 = uVar22;
            }
          } while (0 < (long)uVar26);
        }
        puVar13 = local_a0 + workspace->end;
        if (key != puVar13) {
          lVar17 = (long)pIVar25->Xc_indptr[uVar16 + 1];
          lVar29 = lVar17 + -1;
          if (lVar17 != lVar28) {
            local_60 = (double)(long)pIVar25->Xc_ind[lVar17 + -1];
            while (uVar26 = *key, uVar26 <= (ulong)local_60) {
              piVar15 = pIVar25->Xc_ind;
              iVar35 = piVar15[lVar28];
              if (iVar35 == (int)uVar26) {
                local_98 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)pIVar25->Xc[lVar28];
                pdVar4 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar4) {
                  dVar31 = 1.0;
                  if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
                    local_a8._M_head_impl = key;
                    pVar51 = tsl::detail_robin_hash::
                             robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             ::
                             insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                       (local_38,key,
                                        (piecewise_construct_t *)&std::piecewise_construct,
                                        (tuple<const_unsigned_long_&> *)&local_a8,&local_b1);
                    puVar14 = (pVar51.first.m_bucket.m_bucket)->m_value + 8;
                    pIVar25 = local_b0;
                    goto LAB_0017183e;
                  }
                }
                else {
                  puVar14 = (uchar *)(pdVar4 + uVar26);
LAB_0017183e:
                  dVar31 = *(double *)puVar14;
                }
                if ((ulong)ABS((double)local_98) < 0x7ff0000000000000) {
                  pdVar4 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar4[uVar16] = dVar31 * (double)local_98 + pdVar4[uVar16];
                }
                else {
                  pdVar4 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  pdVar4[uVar16] = pdVar4[uVar16] - dVar31;
                }
                if ((key == local_90 + workspace->end) || (lVar28 == lVar29)) break;
                piVar6 = pIVar25->Xc_ind;
                piVar15 = piVar6 + lVar28;
                key = key + 1;
                uVar26 = (long)piVar6 + (lVar29 * 4 - (long)piVar15) + 4 >> 2;
                if (0 < (long)uVar26) {
                  do {
                    uVar20 = uVar26 >> 1;
                    uVar22 = ~uVar20 + uVar26;
                    uVar26 = uVar20;
                    if ((ulong)(long)(piVar15 + uVar20 + 1)[-1] < *key) {
                      piVar15 = piVar15 + uVar20 + 1;
                      uVar26 = uVar22;
                    }
                  } while (0 < (long)uVar26);
                }
                lVar28 = (long)piVar15 - (long)piVar6;
LAB_001718f7:
                lVar28 = lVar28 >> 2;
              }
              else {
                if (iVar35 <= (int)uVar26) {
                  piVar6 = piVar15 + lVar28 + 1;
                  uVar20 = (long)piVar15 + (lVar29 * 4 - (long)(piVar15 + lVar28 + 1)) + 4 >> 2;
                  while (0 < (long)uVar20) {
                    uVar22 = uVar20 >> 1;
                    uVar23 = ~uVar22 + uVar20;
                    uVar20 = uVar22;
                    if ((ulong)(long)(piVar6 + uVar22 + 1)[-1] < uVar26) {
                      piVar6 = piVar6 + uVar22 + 1;
                      uVar20 = uVar23;
                    }
                  }
                  lVar28 = (long)piVar6 - (long)piVar15;
                  goto LAB_001718f7;
                }
                key = key + 1;
                uVar26 = (long)puVar13 - (long)key >> 3;
                while (0 < (long)uVar26) {
                  uVar20 = uVar26 >> 1;
                  uVar22 = ~uVar20 + uVar26;
                  uVar26 = uVar20;
                  if ((key + uVar20 + 1)[-1] < (ulong)(long)iVar35) {
                    key = key + uVar20 + 1;
                    uVar26 = uVar22;
                  }
                }
              }
              puVar13 = local_a0 + workspace->end;
              if ((key == puVar13) || (lVar28 == lVar17)) break;
            }
          }
        }
        pdVar4 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4[uVar16] =
             pdVar4[uVar16] /
             (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar16 < pIVar25->ncols_numeric);
    }
  }
  auVar38._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
  auVar38._8_4_ = (int)(min_imp_obs >> 0x20);
  auVar38._12_4_ = 0x45300000;
  dVar31 = (auVar38._8_8_ - 1.9342813113834067e+25) + (auVar38._0_8_ - 4503599627370496.0);
  pdVar4 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish != pdVar4) && (sVar3 = local_b0->ncols_numeric, sVar3 != 0)
     ) {
    pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar21 = imputer->parent;
    pIVar7 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar24 = 0;
    do {
      pdVar18 = pdVar5 + sVar24;
      if (*pdVar18 <= dVar31 && dVar31 != *pdVar18) {
        dVar48 = *(double *)
                  (*(long *)&pIVar7[sVar21].num_sum.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  sVar24 * 8);
        dVar45 = 2.0;
        sVar27 = sVar21;
        if (0x7fefffffffffffff < (ulong)ABS(dVar48)) {
          lVar28 = 2;
          do {
            if (sVar27 == 0) {
              pdVar4[sVar24] = NAN;
              dVar45 = 0.0;
              goto LAB_00171a7e;
            }
            sVar27 = pIVar7[sVar27].parent;
            dVar48 = *(double *)
                      (*(long *)&pIVar7[sVar27].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar24 * 8);
            lVar28 = lVar28 + 2;
          } while (0x7fefffffffffffff < (ulong)ABS(dVar48));
          auVar49._8_4_ = (int)((ulong)lVar28 >> 0x20);
          auVar49._0_8_ = lVar28;
          auVar49._12_4_ = 0x45300000;
          dVar45 = (auVar49._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0);
        }
        pdVar4[sVar24] =
             dVar48 / *(double *)
                       (*(long *)&pIVar7[sVar27].num_weight.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       sVar24 * 8);
        dVar45 = (double)local_78._0_8_ / dVar45;
LAB_00171a7e:
        pdVar5[sVar24] = dVar45;
      }
      sVar24 = sVar24 + 1;
    } while (sVar24 != sVar3);
  }
  pvVar19 = (imputer->cat_sum).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((imputer->cat_sum).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != pvVar19) &&
     (sVar3 = local_b0->ncols_categ, sVar3 != 0)) {
    pdVar5 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar21 = imputer->parent;
    pIVar7 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar15 = local_b0->ncat;
    sVar24 = 0;
    do {
      if (dVar31 <= pdVar5[sVar24]) {
        pdVar9 = pvVar19[sVar24].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar18 = pvVar19[sVar24].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
          *pdVar18 = *pdVar18 / pdVar5[sVar24];
        }
      }
      else {
        lVar28 = *(long *)&pIVar7[sVar21].cat_weight.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        dVar48 = 2.0;
        sVar27 = sVar21;
        if (*(double *)(lVar28 + sVar24 * 8) <= 0.0) {
          lVar29 = 2;
          do {
            if (sVar27 == 0) goto LAB_00171bd7;
            sVar27 = pIVar7[sVar27].parent;
            lVar28 = *(long *)&pIVar7[sVar27].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar29 = lVar29 + 2;
          } while (*(double *)(lVar28 + sVar24 * 8) <= 0.0);
          auVar46._8_4_ = (int)((ulong)lVar29 >> 0x20);
          auVar46._0_8_ = lVar29;
          auVar46._12_4_ = 0x45300000;
          dVar48 = (auVar46._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar29) - 4503599627370496.0);
        }
        iVar35 = piVar15[sVar24];
        if (0 < (long)iVar35) {
          lVar29 = *(long *)(*(long *)&pIVar7[sVar27].cat_sum.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl + sVar24 * 0x18);
          pdVar8 = pvVar19[sVar24].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar17 = 0;
          do {
            dVar45 = *(double *)(lVar29 + lVar17 * 8);
            dVar50 = 0.0;
            if (0.0 < dVar45) {
              dVar50 = dVar45 / *(double *)(lVar28 + sVar24 * 8);
            }
            pdVar8[lVar17] = dVar50 + pdVar8[lVar17];
            pdVar5[sVar24] = (double)local_78._0_8_ / dVar48;
            lVar17 = lVar17 + 1;
          } while (iVar35 != lVar17);
        }
LAB_00171bd7:
        dVar48 = 0.0;
        for (pdVar18 = pvVar19[sVar24].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar18 !=
            pvVar19[sVar24].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar18 = pdVar18 + 1) {
          dVar48 = dVar48 + *pdVar18;
        }
        pdVar5[sVar24] = dVar48;
      }
      sVar24 = sVar24 + 1;
    } while (sVar24 != sVar3);
  }
  WVar2 = local_40->weigh_imp_rows;
  if (WVar2 == Flat) {
    pdVar9 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / (double)local_78._0_8_;
    }
    pdVar9 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / (double)local_78._0_8_;
    }
  }
  else if (WVar2 == Inverse) {
    pdVar9 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / (SQRT((double)local_78._0_8_) * (double)local_78._0_8_);
    }
    pdVar9 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / (SQRT((double)local_78._0_8_) * (double)local_78._0_8_);
    }
  }
  lVar28 = local_48 + 1;
  auVar39._8_4_ = (int)((ulong)lVar28 >> 0x20);
  auVar39._0_8_ = lVar28;
  auVar39._12_4_ = 0x45300000;
  dVar31 = (auVar39._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0);
  if (local_40->depth_imp == Higher) {
    pdVar9 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 * dVar31;
    }
    pdVar9 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 * dVar31;
    }
  }
  else if (local_40->depth_imp == Lower) {
    pdVar9 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / dVar31;
    }
    pdVar9 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar9; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / dVar31;
    }
  }
  if ((WVar2 != Prop) || (local_40->depth_imp != Same)) {
    sVar3 = local_b0->ncols_numeric;
    if (sVar3 != 0) {
      pdVar5 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar21 = 0;
      do {
        pdVar4[sVar21] = pdVar5[sVar21] * pdVar4[sVar21];
        sVar21 = sVar21 + 1;
      } while (sVar3 != sVar21);
    }
    sVar3 = local_b0->ncols_categ;
    if (sVar3 != 0) {
      piVar15 = local_b0->ncat;
      pdVar4 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar21 = 0;
      do {
        iVar35 = piVar15[sVar21];
        if (0 < (long)iVar35) {
          pdVar5 = pvVar19[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar28 = 0;
          do {
            pdVar5[lVar28] = pdVar4[sVar21] * pdVar5[lVar28];
            lVar28 = lVar28 + 1;
          } while (iVar35 != lVar28);
        }
        sVar21 = sVar21 + 1;
      } while (sVar21 != sVar3);
    }
  }
  return;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}